

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O3

MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *
vkt::wsi::anon_unknown_0::createWindow
          (MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *__return_storage_ptr__,
          Display *display,Maybe<tcu::Vector<unsigned_int,_2>_> *initialSize)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*display->_vptr_Display[2])(display,initialSize);
  (__return_storage_ptr__->super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>).
  m_data.ptr = (Window *)CONCAT44(extraout_var,iVar1);
  return (MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)
         CONCAT44(extraout_var,iVar1);
}

Assistant:

MovePtr<Window> createWindow (const Display& display, const Maybe<UVec2>& initialSize)
{
	try
	{
		return MovePtr<Window>(display.createWindow(initialSize));
	}
	catch (const tcu::NotSupportedError& e)
	{
		// See createDisplay - assuming that wsi::Display was supported platform port
		// should also support creating a window.
		throw tcu::TestError(e.getMessage());
	}
}